

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdGetIssuanceBlindingKey
              (void *handle,char *master_blinding_key,char *txid,uint32_t vout,char **blinding_key)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  Privkey_conflict *in_RDX;
  char *in_RSI;
  undefined8 *in_R8;
  CfdException *except;
  exception *std_except;
  Privkey privkey;
  ElementsTransactionApi api;
  int32_t in_stack_fffffffffffffdb4;
  Txid *in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffdd0;
  string *in_stack_fffffffffffffe10;
  string local_1d0;
  allocator local_1a9;
  string local_1a8;
  Txid local_188;
  allocator local_161;
  string local_160;
  Privkey local_140;
  Privkey local_120;
  ElementsTransactionApi local_fb;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [32];
  CfdSourceLocation local_d8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  undefined1 local_7a;
  allocator local_79;
  string local_78 [32];
  CfdSourceLocation local_58;
  undefined8 *local_30;
  Privkey_conflict *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
  local_30 = in_R8;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_58.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_58.filename = local_58.filename + 1;
    local_58.line = 0x41d;
    local_58.funcname = "CfdGetIssuanceBlindingKey";
    cfd::core::logger::warn<>(&local_58,"master blinding key is null or empty.");
    local_7a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar4 = &local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_78,"Failed to parameter. master blinding key is null or empty.",paVar4);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffdd0,error_code,in_stack_fffffffffffffdc0);
    local_7a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString((char *)local_20);
  if (!bVar1) {
    if (local_30 == (undefined8 *)0x0) {
      local_d8.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                   ,0x2f);
      local_d8.filename = local_d8.filename + 1;
      local_d8.line = 0x429;
      local_d8.funcname = "CfdGetIssuanceBlindingKey";
      cfd::core::logger::warn<>(&local_d8,"blinding key is null.");
      local_fa = 1;
      uVar2 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"Failed to parameter. blinding key is null.",&local_f9);
      cfd::core::CfdException::CfdException
                (in_stack_fffffffffffffdd0,error_code,in_stack_fffffffffffffdc0);
      local_fa = 0;
      __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    cfd::api::ElementsTransactionApi::ElementsTransactionApi(&local_fb);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_160,local_18,&local_161);
    cfd::core::Privkey::Privkey(&local_140,&local_160,kMainnet,true);
    paVar4 = &local_1a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a8,(char *)local_20,paVar4);
    cfd::core::Txid::Txid(&local_188,&local_1a8);
    cfd::api::ElementsTransactionApi::GetIssuanceBlindingKey
              ((ElementsTransactionApi *)paVar4,local_20,in_stack_fffffffffffffdb8,
               in_stack_fffffffffffffdb4);
    cfd::core::Txid::~Txid((Txid *)0x5acfd4);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    cfd::core::Privkey::~Privkey((Privkey *)0x5acffb);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    cfd::core::Privkey::GetHex_abi_cxx11_(&local_1d0,&local_120);
    pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffe10);
    *local_30 = pcVar3;
    std::__cxx11::string::~string((string *)&local_1d0);
    local_4 = 0;
    cfd::core::Privkey::~Privkey((Privkey *)0x5ad075);
    return local_4;
  }
  local_98.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
               ,0x2f);
  local_98.filename = local_98.filename + 1;
  local_98.line = 0x423;
  local_98.funcname = "CfdGetIssuanceBlindingKey";
  cfd::core::logger::warn<>(&local_98,"txid is null or empty.");
  local_ba = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"Failed to parameter. txid is null or empty.",&local_b9);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffdd0,error_code,in_stack_fffffffffffffdc0);
  local_ba = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetIssuanceBlindingKey(
    void* handle, const char* master_blinding_key, const char* txid,
    uint32_t vout, char** blinding_key) {
  try {
    cfd::Initialize();
    if (IsEmptyString(master_blinding_key)) {
      warn(CFD_LOG_SOURCE, "master blinding key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. master blinding key is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (blinding_key == nullptr) {
      warn(CFD_LOG_SOURCE, "blinding key is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. blinding key is null.");
    }

    ElementsTransactionApi api;
    Privkey privkey = api.GetIssuanceBlindingKey(
        Privkey(std::string(master_blinding_key)), Txid(txid),
        static_cast<int32_t>(vout));

    *blinding_key = CreateString(privkey.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}